

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

void __thiscall OpenMD::Stats::Stats(Stats *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Stats = (_func_int **)&PTR__Stats_00301f18;
  this->info_ = info;
  this->isInit_ = false;
  p_Var1 = &(this->statsMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->statsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->statsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data_).
  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).
  super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->statsMask_).super__Base_bitset<1UL>._M_w = 0;
  (this->statsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->statsMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->statsMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  init(this,(EVP_PKEY_CTX *)info);
  this->isInit_ = true;
  return;
}

Assistant:

Stats::Stats(SimInfo* info) : info_(info), isInit_(false) {
    if (!isInit_) {
      init();
      isInit_ = true;
    }
  }